

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageDashedLine(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000014;
  uint uVar4;
  int iVar5;
  int wid;
  int iVar6;
  int iVar7;
  double dVar8;
  int on;
  int dashStep;
  int local_50;
  undefined4 uStack_4c;
  double local_48;
  gdImagePtr local_40;
  uint local_38;
  uint local_34;
  
  dashStep = 0;
  iVar3 = 1;
  local_34 = x2 - x1;
  uVar1 = -local_34;
  if (0 < (int)local_34) {
    uVar1 = local_34;
  }
  local_38 = y2 - y1;
  uVar4 = -local_38;
  if (0 < (int)local_38) {
    uVar4 = local_38;
  }
  local_48 = (double)im->thick;
  on = iVar3;
  local_40 = im;
  local_50 = y1;
  uStack_4c = in_register_00000014;
  dVar8 = atan2((double)(int)uVar4,(double)(int)uVar1);
  dVar8 = sin(dVar8);
  wid = 1;
  if (dVar8 != 0.0) {
    wid = (int)(local_48 / dVar8);
  }
  if (NAN(dVar8)) {
    wid = (int)(local_48 / dVar8);
  }
  if (uVar4 < uVar1 || uVar4 - uVar1 == 0) {
    iVar6 = x1;
    iVar5 = local_50;
    if (x2 < x1) {
      iVar3 = -1;
      iVar6 = x2;
      x2 = x1;
      iVar5 = y2;
    }
    _local_50 = CONCAT44(uStack_4c,iVar3);
    local_48 = (double)CONCAT44(local_48._4_4_,uVar4 * 2);
    iVar7 = uVar4 * 2 - uVar1;
    iVar3 = (uVar4 - uVar1) * 2;
    dashedSet(local_40,iVar6,iVar5,color,&on,&dashStep,wid,1);
    if ((int)(local_50 * local_38) < 1) {
      while( true ) {
        iVar6 = iVar6 + 1;
        if (-x2 + iVar6 == 1) break;
        iVar2 = local_48._0_4_;
        if (-1 < iVar7) {
          iVar2 = iVar3;
        }
        iVar5 = iVar5 - (uint)(-1 < iVar7);
        iVar7 = iVar7 + iVar2;
        dashedSet(local_40,iVar6,iVar5,color,&on,&dashStep,wid,1);
      }
    }
    else {
      while( true ) {
        iVar6 = iVar6 + 1;
        if (-x2 + iVar6 == 1) break;
        iVar2 = local_48._0_4_;
        if (-1 < iVar7) {
          iVar2 = iVar3;
        }
        iVar5 = iVar5 + (uint)(-1 < iVar7);
        iVar7 = iVar7 + iVar2;
        dashedSet(local_40,iVar6,iVar5,color,&on,&dashStep,wid,1);
      }
    }
  }
  else {
    local_48 = (double)CONCAT44(local_48._4_4_,uVar1 * 2);
    if (y2 < local_50) {
      iVar3 = -1;
      iVar6 = local_50;
    }
    else {
      iVar3 = 1;
      x2 = x1;
      iVar6 = y2;
      uStack_4c = 0;
      y2 = local_50;
    }
    local_50 = iVar6;
    iVar7 = uVar1 * 2 - uVar4;
    iVar6 = (uVar1 - uVar4) * 2;
    dashedSet(local_40,x2,y2,color,&on,&dashStep,wid,0);
    iVar5 = local_50;
    if ((int)(iVar3 * local_34) < 1) {
      while (y2 = y2 + 1, y2 - iVar5 != 1) {
        iVar3 = local_48._0_4_;
        if (-1 < iVar7) {
          iVar3 = iVar6;
        }
        x2 = x2 - (uint)(-1 < iVar7);
        iVar7 = iVar7 + iVar3;
        dashedSet(local_40,x2,y2,color,&on,&dashStep,wid,0);
      }
    }
    else {
      while (y2 = y2 + 1, y2 - iVar5 != 1) {
        iVar3 = local_48._0_4_;
        if (-1 < iVar7) {
          iVar3 = iVar6;
        }
        x2 = x2 + (uint)(-1 < iVar7);
        iVar7 = iVar7 + iVar3;
        dashedSet(local_40,x2,y2,color,&on,&dashStep,wid,0);
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageDashedLine (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int dx, dy, incr1, incr2, d, x, y, xend, yend, xdirflag, ydirflag;
	int dashStep = 0;
	int on = 1;
	int wid;
	int vert;
	int thick = im->thick;

	dx = abs (x2 - x1);
	dy = abs (y2 - y1);
	if (dy <= dx) {
		/* More-or-less horizontal. use wid for vertical stroke */
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		vert = 1;

		d = 2 * dy - dx;
		incr1 = 2 * dy;
		incr2 = 2 * (dy - dx);
		if (x1 > x2) {
			x = x2;
			y = y2;
			ydirflag = (-1);
			xend = x1;
		} else {
			x = x1;
			y = y1;
			ydirflag = 1;
			xend = x2;
		}
		dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
		if (((y2 - y1) * ydirflag) > 0) {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y++;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		} else {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y--;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		}
	} else {
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		vert = 0;

		d = 2 * dx - dy;
		incr1 = 2 * dx;
		incr2 = 2 * (dx - dy);
		if (y1 > y2) {
			y = y2;
			x = x2;
			yend = y1;
			xdirflag = (-1);
		} else {
			y = y1;
			x = x1;
			yend = y2;
			xdirflag = 1;
		}
		dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
		if (((x2 - x1) * xdirflag) > 0) {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x++;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		} else {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x--;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		}
	}
}